

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigDup.c
# Opt level: O3

Aig_Man_t * Saig_ManDupCones(Aig_Man_t *pAig,int *pPos,int nPos)

{
  void *pvVar1;
  char *__s;
  int *piVar2;
  Vec_Ptr_t *vLeaves;
  void **ppvVar3;
  Vec_Ptr_t *vNodes;
  Vec_Ptr_t *vRoots;
  Aig_Man_t *p;
  size_t sVar4;
  char *__dest;
  Aig_Obj_t *pAVar5;
  int iVar6;
  uint uVar7;
  Aig_Obj_t *p1;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  
  vLeaves = (Vec_Ptr_t *)malloc(0x10);
  vLeaves->nCap = 100;
  vLeaves->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  vLeaves->pArray = ppvVar3;
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  vNodes->nCap = 100;
  vNodes->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  vNodes->pArray = ppvVar3;
  vRoots = (Vec_Ptr_t *)malloc(0x10);
  vRoots->nCap = 100;
  vRoots->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  vRoots->pArray = ppvVar3;
  uVar8 = (ulong)(uint)nPos;
  if (0 < nPos) {
    iVar6 = 0;
    uVar11 = 100;
    uVar9 = 0;
    do {
      iVar10 = pPos[uVar9];
      if (((long)iVar10 < 0) || (pAig->vCos->nSize <= iVar10)) goto LAB_006e2ae3;
      pvVar1 = pAig->vCos->pArray[iVar10];
      iVar10 = (int)uVar11;
      if (iVar6 == iVar10) {
        if (iVar10 < 0x10) {
          if (vRoots->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(0x80);
          }
          else {
            ppvVar3 = (void **)realloc(vRoots->pArray,0x80);
          }
          vRoots->pArray = ppvVar3;
          vRoots->nCap = 0x10;
          uVar11 = 0x10;
        }
        else {
          uVar11 = (ulong)(uint)(iVar10 * 2);
          if (vRoots->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(uVar11 * 8);
          }
          else {
            ppvVar3 = (void **)realloc(vRoots->pArray,uVar11 * 8);
          }
          vRoots->pArray = ppvVar3;
          vRoots->nCap = iVar10 * 2;
        }
      }
      else {
        ppvVar3 = vRoots->pArray;
      }
      iVar10 = vRoots->nSize;
      iVar6 = iVar10 + 1;
      vRoots->nSize = iVar6;
      ppvVar3[iVar10] = pvVar1;
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  Aig_ManIncrementTravId(pAig);
  pAig->pConst1->TravId = pAig->nTravIds;
  if (0 < vRoots->nSize) {
    lVar12 = 0;
    do {
      Saig_ManDupCones_rec(pAig,(Aig_Obj_t *)vRoots->pArray[lVar12],vLeaves,vNodes,vRoots);
      lVar12 = lVar12 + 1;
    } while (lVar12 < vRoots->nSize);
  }
  p = Aig_ManStart(vNodes->nSize);
  __s = pAig->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar4 = strlen(__s);
    __dest = (char *)malloc(sVar4 + 1);
    strcpy(__dest,__s);
  }
  p->pName = __dest;
  pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  if (0 < vLeaves->nSize) {
    lVar12 = 0;
    do {
      pvVar1 = vLeaves->pArray[lVar12];
      pAVar5 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar5;
      lVar12 = lVar12 + 1;
    } while (lVar12 < vLeaves->nSize);
  }
  iVar6 = vRoots->nSize;
  if (nPos < iVar6) {
    do {
      if (nPos < 0) {
LAB_006e2ae3:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      piVar2 = (int *)vRoots->pArray[uVar8];
      pAVar5 = Aig_ObjCreateCi(p);
      if (((piVar2[6] & 7U) != 3) || (iVar6 = *piVar2, iVar6 < pAig->nTruePos)) {
        __assert_fail("Saig_ObjIsLi(p, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saig.h"
                      ,0x57,"Aig_Obj_t *Saig_ObjLiToLo(Aig_Man_t *, Aig_Obj_t *)");
      }
      uVar7 = (iVar6 - pAig->nTruePos) + pAig->nTruePis;
      if (((int)uVar7 < 0) || (pAig->vCis->nSize <= (int)uVar7)) goto LAB_006e2ae3;
      *(Aig_Obj_t **)((long)pAig->vCis->pArray[uVar7] + 0x28) = pAVar5;
      uVar8 = uVar8 + 1;
      iVar6 = vRoots->nSize;
    } while ((int)uVar8 < iVar6);
  }
  if (0 < vNodes->nSize) {
    lVar12 = 0;
    do {
      pvVar1 = vNodes->pArray[lVar12];
      if (((ulong)pvVar1 & 1) != 0) goto LAB_006e2b02;
      uVar8 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
      if (uVar8 == 0) {
        pAVar5 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar5 = (Aig_Obj_t *)
                 ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar8 + 0x28));
      }
      uVar8 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
      if (uVar8 == 0) {
        p1 = (Aig_Obj_t *)0x0;
      }
      else {
        p1 = (Aig_Obj_t *)
             ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^ *(ulong *)(uVar8 + 0x28));
      }
      pAVar5 = Aig_And(p,pAVar5,p1);
      *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar5;
      lVar12 = lVar12 + 1;
    } while (lVar12 < vNodes->nSize);
    iVar6 = vRoots->nSize;
  }
  if (0 < iVar6) {
    lVar12 = 0;
    do {
      if (((ulong)vRoots->pArray[lVar12] & 1) != 0) {
LAB_006e2b02:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar8 = *(ulong *)((long)vRoots->pArray[lVar12] + 8);
      uVar9 = uVar8 & 0xfffffffffffffffe;
      if (uVar9 == 0) {
        pAVar5 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar5 = (Aig_Obj_t *)((ulong)((uint)uVar8 & 1) ^ *(ulong *)(uVar9 + 0x28));
      }
      Aig_ObjCreateCo(p,pAVar5);
      lVar12 = lVar12 + 1;
      iVar6 = vRoots->nSize;
    } while (lVar12 < iVar6);
  }
  Aig_ManSetRegNum(p,iVar6 - nPos);
  if (vLeaves->pArray != (void **)0x0) {
    free(vLeaves->pArray);
  }
  free(vLeaves);
  if (vNodes->pArray != (void **)0x0) {
    free(vNodes->pArray);
  }
  free(vNodes);
  if (vRoots->pArray != (void **)0x0) {
    free(vRoots->pArray);
  }
  free(vRoots);
  return p;
}

Assistant:

Aig_Man_t * Saig_ManDupCones( Aig_Man_t * pAig, int * pPos, int nPos )
{
    Aig_Man_t * pAigNew;
    Vec_Ptr_t * vLeaves, * vNodes, * vRoots;
    Aig_Obj_t * pObj;
    int i;

    // collect initial POs
    vLeaves = Vec_PtrAlloc( 100 );
    vNodes = Vec_PtrAlloc( 100 );
    vRoots = Vec_PtrAlloc( 100 );
    for ( i = 0; i < nPos; i++ )
        Vec_PtrPush( vRoots, Aig_ManCo(pAig, pPos[i]) );

    // mark internal nodes
    Aig_ManIncrementTravId( pAig );
    Aig_ObjSetTravIdCurrent( pAig, Aig_ManConst1(pAig) );
    Vec_PtrForEachEntry( Aig_Obj_t *, vRoots, pObj, i )
        Saig_ManDupCones_rec( pAig, pObj, vLeaves, vNodes, vRoots );

    // start the new manager
    pAigNew = Aig_ManStart( Vec_PtrSize(vNodes) );
    pAigNew->pName = Abc_UtilStrsav( pAig->pName );
    // map the constant node
    Aig_ManConst1(pAig)->pData = Aig_ManConst1( pAigNew );
    // create PIs
    Vec_PtrForEachEntry( Aig_Obj_t *, vLeaves, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pAigNew );
    // create LOs
    Vec_PtrForEachEntryStart( Aig_Obj_t *, vRoots, pObj, i, nPos )
        Saig_ObjLiToLo(pAig, pObj)->pData = Aig_ObjCreateCi( pAigNew );
    // create internal nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        pObj->pData = Aig_And( pAigNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // create COs
    Vec_PtrForEachEntry( Aig_Obj_t *, vRoots, pObj, i )
        Aig_ObjCreateCo( pAigNew, Aig_ObjChild0Copy(pObj) );
    // finalize
    Aig_ManSetRegNum( pAigNew, Vec_PtrSize(vRoots)-nPos );
    Vec_PtrFree( vLeaves );
    Vec_PtrFree( vNodes );
    Vec_PtrFree( vRoots );
    return pAigNew;

}